

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O0

int keysymToQtKey_internal
              (xkb_keysym_t keysym,KeyboardModifiers modifiers,xkb_state *state,xkb_keycode_t code,
              bool superAsMeta,bool hyperAsMeta)

{
  QStringView string;
  uint uVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  QStringIterator *pQVar5;
  undefined4 in_ECX;
  xkb2qt *in_RDX;
  char32_t in_EDI;
  uint in_R8D;
  byte in_R9B;
  long in_FS_OFFSET;
  xkb2qt *it;
  int qtKey;
  QStringIterator i;
  QString text;
  xkb2qt_t searchKey;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  KeyboardModifier other;
  const_iterator in_stack_ffffffffffffff10;
  QStringIterator *in_stack_ffffffffffffff18;
  xkb2qt *in_stack_ffffffffffffff30;
  QStringIterator *that;
  char32_t local_c4;
  xkb2qt *pxVar6;
  xkb_keycode_t in_stack_ffffffffffffff54;
  xkb_state *in_stack_ffffffffffffff58;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  xkb2qt local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = in_R8D & 1;
  local_c4 = L'\0';
  pxVar6 = in_RDX;
  if (((uint)in_EDI < 0xffbe) || (0xffe0 < (uint)in_EDI)) {
    if (((uint)in_EDI < 0xffb0) || (0xffb9 < (uint)in_EDI)) {
      bVar2 = QXkbCommon::isLatin1(in_EDI);
      if (bVar2) {
        local_c4 = QXkbCommon::qxkbcommon_xkb_keysym_to_upper(0);
        bVar2 = QXkbCommon::isLatin1(local_c4);
        if (!bVar2) {
          local_c4 = in_EDI;
        }
      }
      else {
        local_14.qt = 0;
        local_14.xkb = in_EDI;
        in_stack_ffffffffffffff10 =
             std::array<xkb2qt,_305UL>::cbegin((array<xkb2qt,_305UL> *)0xb3ee93);
        std::array<xkb2qt,_305UL>::cend((array<xkb2qt,_305UL> *)0xb3eea4);
        in_stack_ffffffffffffff18 =
             (QStringIterator *)
             std::lower_bound<xkb2qt_const*,xkb2qt>
                       (in_stack_ffffffffffffff30,in_RDX,(xkb2qt *)CONCAT44(in_ECX,in_R8D));
        that = in_stack_ffffffffffffff18;
        pQVar5 = (QStringIterator *)std::array<xkb2qt,_305UL>::end((array<xkb2qt,_305UL> *)0xb3eed4)
        ;
        if ((in_stack_ffffffffffffff18 != pQVar5) &&
           (bVar2 = xkb2qt::operator<(&local_14,(xkb2qt *)that), !bVar2)) {
          local_c4 = *(char32_t *)((long)&that->i + 4);
        }
        if ((uVar1 != 0) && ((local_c4 == L'\x01000053' || (local_c4 == L'\x01000054')))) {
          local_c4 = L'\x01000022';
        }
        if (((in_R9B & 1) != 0) && ((local_c4 == L'\x01000056' || (local_c4 == L'\x01000057')))) {
          local_c4 = L'\x01000022';
        }
      }
    }
    else {
      local_c4 = in_EDI + L'\xffff0080';
    }
  }
  else {
    local_c4 = in_EDI + L'\x00ff0072';
  }
  if (local_c4 == L'\0') {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0xb3ef9d);
    other = CONCAT13(1,(int3)in_stack_ffffffffffffff0c);
    if (pxVar6 != (xkb2qt *)0x0) {
      local_34.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QFlags<Qt::KeyboardModifier>::operator&
                     ((QFlags<Qt::KeyboardModifier> *)in_stack_ffffffffffffff10,other);
      IVar3 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
      other = CONCAT13(IVar3 != 0,(int3)other);
    }
    if ((char)(other >> 0x18) == '\0') {
      QXkbCommon::lookupString(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
      QString::operator=((QString *)in_stack_ffffffffffffff10,
                         (QString *)CONCAT44(other,in_stack_ffffffffffffff08));
      QString::~QString((QString *)0xb3f052);
    }
    else {
      QXkbCommon::lookupStringNoKeysymTransformations((xkb_keysym_t)((ulong)pxVar6 >> 0x20));
      QString::operator=((QString *)in_stack_ffffffffffffff10,
                         (QString *)CONCAT44(other,in_stack_ffffffffffffff08));
      QString::~QString((QString *)0xb3f018);
    }
    bVar2 = QString::isEmpty((QString *)0xb3f05f);
    if (!bVar2) {
      QString::unicode((QString *)0xb3f074);
      bVar2 = QChar::isDigit((QChar *)0xb3f07c);
      if (bVar2) {
        QString::unicode((QString *)0xb3f08f);
        iVar4 = QChar::digitValue((QChar *)0xb3f097);
        local_c4 = iVar4 + L'0';
      }
      else {
        QString::toUpper((QString *)CONCAT44(other,in_stack_ffffffffffffff08));
        QString::operator=((QString *)in_stack_ffffffffffffff10,
                           (QString *)CONCAT44(other,in_stack_ffffffffffffff08));
        QString::~QString((QString *)0xb3f0d1);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)CONCAT44(in_ECX,in_R8D),(QString *)in_stack_ffffffffffffff18);
        string.m_size._4_4_ = in_ECX;
        string.m_size._0_4_ = in_R8D;
        string.m_data = (storage_type_conflict *)in_RDX;
        QStringIterator::QStringIterator
                  (in_stack_ffffffffffffff18,string,(qsizetype)in_stack_ffffffffffffff10);
        local_c4 = QStringIterator::next
                             (in_stack_ffffffffffffff18,
                              (char32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      }
    }
    QString::~QString((QString *)0xb3f146);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c4;
}

Assistant:

static int keysymToQtKey_internal(xkb_keysym_t keysym, Qt::KeyboardModifiers modifiers,
                                  xkb_state *state, xkb_keycode_t code,
                                  bool superAsMeta, bool hyperAsMeta)
{
    int qtKey = 0;

    // lookup from direct mapping
    if (keysym >= XKB_KEY_F1 && keysym <= XKB_KEY_F35) {
        // function keys
        qtKey = Qt::Key_F1 + (keysym - XKB_KEY_F1);
    } else if (keysym >= XKB_KEY_KP_0 && keysym <= XKB_KEY_KP_9) {
        // numeric keypad keys
        qtKey = Qt::Key_0 + (keysym - XKB_KEY_KP_0);
    } else if (QXkbCommon::isLatin1(keysym)) {
        // Most Qt::Key values are determined by their upper-case version,
        // where this is in the Latin-1 repertoire. So start with that:
        qtKey = QXkbCommon::qxkbcommon_xkb_keysym_to_upper(keysym);
        // However, Key_mu and Key_ydiaeresis are U+00B5 MICRO SIGN and
        // U+00FF LATIN SMALL LETTER Y WITH DIAERESIS, both lower-case,
        // with upper-case forms outside Latin-1, so use them as they are
        // since they're the Qt::Key values.
        if (!QXkbCommon::isLatin1(qtKey))
            qtKey = keysym;
    } else {
        // check if we have a direct mapping
        xkb2qt_t searchKey{keysym, 0};
        auto it = std::lower_bound(KeyTbl.cbegin(), KeyTbl.cend(), searchKey);
        if (it != KeyTbl.end() && !(searchKey < *it))
            qtKey = it->qt;

        // translate Super/Hyper keys to Meta if we're using them as the MetaModifier
        if (superAsMeta && (qtKey == Qt::Key_Super_L || qtKey == Qt::Key_Super_R))
            qtKey = Qt::Key_Meta;
        if (hyperAsMeta && (qtKey == Qt::Key_Hyper_L || qtKey == Qt::Key_Hyper_R))
            qtKey = Qt::Key_Meta;
    }

    if (qtKey)
        return qtKey;

    // lookup from unicode
    QString text;
    if (!state || modifiers & Qt::ControlModifier) {
        // Control modifier changes the text to ASCII control character, therefore we
        // can't use this text to map keysym to a qt key. We can use the same keysym
        // (it is not affectd by transformation) to obtain untransformed text. For details
        // see "Appendix A. Default Symbol Transformations" in the XKB specification.
        text = QXkbCommon::lookupStringNoKeysymTransformations(keysym);
    } else {
        text = QXkbCommon::lookupString(state, code);
    }
    if (!text.isEmpty()) {
         if (text.unicode()->isDigit()) {
             // Ensures that also non-latin digits are mapped to corresponding qt keys,
             // e.g CTRL + ۲ (arabic two), is mapped to CTRL + Qt::Key_2.
             qtKey = Qt::Key_0 + text.unicode()->digitValue();
         } else {
             text = text.toUpper();
             QStringIterator i(text);
             qtKey = i.next(0);
         }
    }

    return qtKey;
}